

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_product_definition_sub_init(parser_info *info,char **attr)

{
  int iVar1;
  char *pcVar2;
  char *format_string;
  char *id;
  char **attr_local;
  parser_info *info_local;
  
  if (info->product_definition != (coda_product_definition *)0x0) {
    info->node->free_data = dummy_free_handler;
    info->node->data = info->product_definition;
    pcVar2 = get_mandatory_attribute_value(attr,"id",info->node->tag);
    if (pcVar2 == (char *)0x0) {
      info_local._4_4_ = -1;
    }
    else {
      iVar1 = strcmp(info->product_definition->name,pcVar2);
      if (iVar1 == 0) {
        pcVar2 = get_mandatory_attribute_value(attr,"format",info->node->tag);
        if (pcVar2 == (char *)0x0) {
          info_local._4_4_ = -1;
        }
        else {
          iVar1 = coda_format_from_string(pcVar2,&info->node->format);
          if (iVar1 == 0) {
            info->node->format_set = 1;
            if (info->product_definition->format == info->node->format) {
              if (info->product_definition->format == coda_format_xml) {
                register_sub_element
                          (info->node,element_cd_record,xml_root_init,
                           cd_product_definition_set_root_type);
              }
              else {
                register_type_elements(info->node,cd_product_definition_set_root_type);
              }
              register_sub_element
                        (info->node,element_cd_product_variable,cd_product_variable_init,
                         cd_product_definition_add_product_variable);
              info->node->finalise_element = cd_product_definition_finalise;
              info_local._4_4_ = 0;
            }
            else {
              coda_set_error(-400,
                             "format for product definition %s differs between index and product file"
                             ,info->product_definition->name);
              info_local._4_4_ = -1;
            }
          }
          else {
            info_local._4_4_ = -1;
          }
        }
      }
      else {
        coda_set_error(-400,"invalid id attribute value (%s) for product definition %s",pcVar2,
                       info->product_definition->name);
        info_local._4_4_ = -1;
      }
    }
    return info_local._4_4_;
  }
  __assert_fail("info->product_definition != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                ,0xba3,"int cd_product_definition_sub_init(parser_info *, const char **)");
}

Assistant:

static int cd_product_definition_sub_init(parser_info *info, const char **attr)
{
    const char *id;
    const char *format_string;

    assert(info->product_definition != NULL);
    info->node->free_data = dummy_free_handler;
    info->node->data = info->product_definition;

    id = get_mandatory_attribute_value(attr, "id", info->node->tag);
    if (id == NULL)
    {
        return -1;
    }
    if (strcmp(info->product_definition->name, id) != 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid id attribute value (%s) for product definition %s", id,
                       info->product_definition->name);
        return -1;
    }
    format_string = get_mandatory_attribute_value(attr, "format", info->node->tag);
    if (format_string == NULL)
    {
        return -1;
    }
    if (coda_format_from_string(format_string, &info->node->format) != 0)
    {
        return -1;
    }
    info->node->format_set = 1;
    if (info->product_definition->format != info->node->format)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION,
                       "format for product definition %s differs between index and product file",
                       info->product_definition->name);
        return -1;
    }

    if (info->product_definition->format == coda_format_xml)
    {
        register_sub_element(info->node, element_cd_record, xml_root_init, cd_product_definition_set_root_type);
    }
    else
    {
        register_type_elements(info->node, cd_product_definition_set_root_type);
    }
    register_sub_element(info->node, element_cd_product_variable, cd_product_variable_init,
                         cd_product_definition_add_product_variable);
    info->node->finalise_element = cd_product_definition_finalise;

    return 0;
}